

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall tcu::x11::glx::GlxRenderContext::makeCurrent(GlxRenderContext *this)

{
  int iVar1;
  GlxDrawable *pGVar2;
  Display *pDVar3;
  GLXDrawable drawRead;
  GlxRenderContext *this_local;
  
  pGVar2 = de::details::
           UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>::
           operator->(&(this->m_glxDrawable).
                       super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                     );
  iVar1 = (*pGVar2->_vptr_GlxDrawable[5])();
  pDVar3 = XlibDisplay::getXDisplay(&(this->m_glxDisplay).super_XlibDisplay);
  iVar1 = glXMakeContextCurrent(pDVar3,iVar1,iVar1,this->m_GLXContext);
  checkGLX<int>(iVar1,
                "glXMakeContextCurrent(m_glxDisplay.getXDisplay(), drawRead, drawRead, m_GLXContext)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                ,0x2bf);
  return;
}

Assistant:

void GlxRenderContext::makeCurrent (void)
{
	const GLXDrawable drawRead = m_glxDrawable->getGLXDrawable();
	TCU_CHECK_GLX(glXMakeContextCurrent(m_glxDisplay.getXDisplay(),
										drawRead, drawRead, m_GLXContext));
}